

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

_Bool roaring64_bitmap_contains(roaring64_bitmap_t *r,uint64_t val)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  undefined8 in_RAX;
  art_val_t *paVar5;
  uint *puVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  uint8_t high48 [6];
  uint local_18;
  ushort local_14;
  undefined2 uStack_12;
  
  uStack_12 = (undefined2)((ulong)in_RAX >> 0x30);
  _local_18 = CONCAT24((ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00,
                       (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
                       (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000);
  paVar5 = art_find(&r->art,(art_key_chunk_t *)&local_18);
  if (paVar5 != (art_val_t *)0x0) {
    uVar7 = *paVar5;
    puVar6 = (uint *)r->containers[uVar7 >> 8];
    if ((char)uVar7 == '\x04') {
      uVar7 = (ulong)(byte)puVar6[2];
      puVar6 = *(uint **)puVar6;
    }
    lVar2 = *(long *)(puVar6 + 2);
    uVar8 = (ushort)val;
    if ((char)uVar7 != '\x03') {
      if (((uint)uVar7 & 0xff) != 2) {
        return (*(ulong *)(lVar2 + (ulong)((uint)(val >> 3) & 0x1ff8)) >> (val & 0x3f) & 1) != 0;
      }
      uVar9 = 0;
      uVar10 = *puVar6;
      do {
        iVar3 = uVar9 + 0x10;
        while( true ) {
          if ((int)uVar10 <= iVar3) {
            if ((int)uVar10 <= (int)uVar9) {
              return false;
            }
            uVar7 = (ulong)uVar9;
            while( true ) {
              uVar1 = *(ushort *)(lVar2 + uVar7 * 2);
              bVar12 = uVar1 == uVar8;
              if (bVar12) {
                return bVar12;
              }
              if (uVar8 <= uVar1 && !bVar12) break;
              iVar3 = (int)uVar7;
              uVar7 = uVar7 + 1;
              if (uVar10 - 1 == iVar3) {
                return bVar12;
              }
            }
            return bVar12;
          }
          uVar4 = (uVar10 - 1) + uVar9;
          uVar11 = uVar4 >> 1;
          uVar1 = *(ushort *)(lVar2 + (ulong)(uVar4 & 0xfffffffe));
          if (uVar8 <= uVar1) break;
          uVar9 = uVar11 + 1;
          iVar3 = uVar11 + 0x11;
        }
        uVar10 = uVar11;
      } while (uVar8 < uVar1);
      return true;
    }
    if (0 < (int)*puVar6) {
      iVar3 = *puVar6 - 1;
      uVar7 = 0;
      do {
        uVar9 = (uint)(iVar3 + (int)uVar7) >> 1;
        uVar1 = *(ushort *)(lVar2 + (ulong)uVar9 * 4);
        if (uVar1 < uVar8) {
          uVar7 = (ulong)(uVar9 + 1);
        }
        else {
          if (uVar1 <= uVar8) {
            return true;
          }
          iVar3 = uVar9 - 1;
        }
      } while ((int)uVar7 <= iVar3);
      if (((int)uVar7 != 0) &&
         ((int)(((uint)val & 0xffff) - (uint)*(ushort *)(lVar2 + -4 + uVar7 * 4)) <=
          (int)(uint)*(ushort *)(lVar2 + -2 + uVar7 * 4))) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool roaring64_bitmap_contains(const roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = (leaf_t *)art_find(&r->art, high48);
    if (leaf != NULL) {
        return container_contains(get_container(r, *leaf), low16,
                                  get_typecode(*leaf));
    }
    return false;
}